

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzintrulelist.cpp
# Opt level: O0

void __thiscall TPZIntRuleList::~TPZIntRuleList(TPZIntRuleList *this)

{
  TPZGaussRule *pTVar1;
  TPZIntRuleT *pTVar2;
  TPZIntRuleT3D *pTVar3;
  void *pvVar4;
  int64_t iVar5;
  TPZGaussRule **ppTVar6;
  TPZIntRuleT **ppTVar7;
  TPZIntRuleP3D **ppTVar8;
  TPZVec<TPZGaussRule_*> *in_RDI;
  int i;
  TPZIntRuleT3D *in_stack_ffffffffffffff50;
  TPZIntRuleT3D **in_stack_ffffffffffffff78;
  TPZVec<TPZIntRuleT3D_*> *in_stack_ffffffffffffff80;
  int local_c;
  
  for (local_c = 0; iVar5 = TPZVec<TPZGaussRule_*>::NElements(in_RDI), local_c < iVar5;
      local_c = local_c + 1) {
    ppTVar6 = TPZVec<TPZGaussRule_*>::operator[](in_RDI,(long)local_c);
    if (*ppTVar6 != (TPZGaussRule *)0x0) {
      ppTVar6 = TPZVec<TPZGaussRule_*>::operator[](in_RDI,(long)local_c);
      pTVar1 = *ppTVar6;
      if (pTVar1 != (TPZGaussRule *)0x0) {
        TPZGaussRule::~TPZGaussRule((TPZGaussRule *)in_stack_ffffffffffffff50);
        operator_delete(pTVar1,0x80);
      }
    }
  }
  TPZVec<TPZGaussRule_*>::Resize
            ((TPZVec<TPZGaussRule_*> *)in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78)
  ;
  for (local_c = 0; iVar5 = TPZVec<TPZIntRuleT_*>::NElements((TPZVec<TPZIntRuleT_*> *)(in_RDI + 1)),
      local_c < iVar5; local_c = local_c + 1) {
    ppTVar7 = TPZVec<TPZIntRuleT_*>::operator[]((TPZVec<TPZIntRuleT_*> *)(in_RDI + 1),(long)local_c)
    ;
    if (*ppTVar7 != (TPZIntRuleT *)0x0) {
      ppTVar7 = TPZVec<TPZIntRuleT_*>::operator[]
                          ((TPZVec<TPZIntRuleT_*> *)(in_RDI + 1),(long)local_c);
      pTVar2 = *ppTVar7;
      if (pTVar2 != (TPZIntRuleT *)0x0) {
        TPZIntRuleT::~TPZIntRuleT((TPZIntRuleT *)in_stack_ffffffffffffff50);
        operator_delete(pTVar2,0x260);
      }
    }
  }
  TPZVec<TPZIntRuleT_*>::Resize
            ((TPZVec<TPZIntRuleT_*> *)in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78);
  for (local_c = 0;
      iVar5 = TPZVec<TPZIntRuleT3D_*>::NElements((TPZVec<TPZIntRuleT3D_*> *)(in_RDI + 2)),
      local_c < iVar5; local_c = local_c + 1) {
    in_stack_ffffffffffffff80 =
         (TPZVec<TPZIntRuleT3D_*> *)
         TPZVec<TPZIntRuleT3D_*>::operator[]((TPZVec<TPZIntRuleT3D_*> *)(in_RDI + 2),(long)local_c);
    if ((TPZIntRuleT3D *)in_stack_ffffffffffffff80->_vptr_TPZVec != (TPZIntRuleT3D *)0x0) {
      in_stack_ffffffffffffff78 =
           TPZVec<TPZIntRuleT3D_*>::operator[]
                     ((TPZVec<TPZIntRuleT3D_*> *)(in_RDI + 2),(long)local_c);
      pTVar3 = *in_stack_ffffffffffffff78;
      if (pTVar3 != (TPZIntRuleT3D *)0x0) {
        TPZIntRuleT3D::~TPZIntRuleT3D(in_stack_ffffffffffffff50);
        operator_delete(pTVar3,800);
      }
    }
  }
  TPZVec<TPZIntRuleT3D_*>::Resize(in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78);
  for (local_c = 0;
      iVar5 = TPZVec<TPZIntRuleP3D_*>::NElements((TPZVec<TPZIntRuleP3D_*> *)(in_RDI + 3)),
      local_c < iVar5; local_c = local_c + 1) {
    ppTVar8 = TPZVec<TPZIntRuleP3D_*>::operator[]
                        ((TPZVec<TPZIntRuleP3D_*> *)(in_RDI + 3),(long)local_c);
    if (*ppTVar8 != (TPZIntRuleP3D *)0x0) {
      in_stack_ffffffffffffff50 =
           (TPZIntRuleT3D *)
           TPZVec<TPZIntRuleP3D_*>::operator[]
                     ((TPZVec<TPZIntRuleP3D_*> *)(in_RDI + 3),(long)local_c);
      pvVar4 = *(void **)in_stack_ffffffffffffff50;
      if (pvVar4 != (void *)0x0) {
        TPZIntRuleP3D::~TPZIntRuleP3D((TPZIntRuleP3D *)in_stack_ffffffffffffff50);
        operator_delete(pvVar4,0x90);
      }
    }
  }
  TPZVec<TPZIntRuleP3D_*>::Resize
            ((TPZVec<TPZIntRuleP3D_*> *)in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78
            );
  TPZVec<TPZIntRuleP3D_*>::~TPZVec((TPZVec<TPZIntRuleP3D_*> *)in_stack_ffffffffffffff50);
  TPZVec<TPZIntRuleT3D_*>::~TPZVec((TPZVec<TPZIntRuleT3D_*> *)in_stack_ffffffffffffff50);
  TPZVec<TPZIntRuleT_*>::~TPZVec((TPZVec<TPZIntRuleT_*> *)in_stack_ffffffffffffff50);
  TPZVec<TPZGaussRule_*>::~TPZVec((TPZVec<TPZGaussRule_*> *)in_stack_ffffffffffffff50);
  return;
}

Assistant:

TPZIntRuleList::~TPZIntRuleList() {
	int i;
	/** Deleting dinamic allocation of the Gauss integration rules at the vector */
	for(i=0 ; i<fintlist.NElements() ; i++)   if (fintlist[i])   delete fintlist[i];
	fintlist.Resize(0);
	/** Deleting dinamic allocation of the cubature rules for triangle at the vector */
	for(i=0 ; i<fintlistT.NElements() ; i++)   if (fintlistT[i])   delete fintlistT[i];
	fintlistT.Resize(0);
	/** Deleting dinamic allocation of the cubature rules for tetrahedra at the vector */
	for(i=0 ; i<fintlistT3D.NElements() ; i++)   if (fintlistT3D[i])   delete fintlistT3D[i];
	fintlistT3D.Resize(0);
	
	/** Deleting dinamic allocation of the cubature rules for pyramid at the vector */
	for(i=0 ; i<fintlistP3D.NElements() ; i++)   if (fintlistP3D[i])   delete fintlistP3D[i];
	fintlistP3D.Resize(0);
}